

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_casting.hpp
# Opt level: O0

bool duckdb::CSVCast::
     TemplatedTryCastDateVector<duckdb::CSVCast::TryCastDateOperator,duckdb::date_t>
               (map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                *options,Vector *input_vector,Vector *result_vector,idx_t count,
               CastParameters *parameters,idx_t *line_error,bool nullify_error)

{
  anon_class_56_7_54dcd5a2 fun;
  ValidityMask *pVVar1;
  undefined8 in_RDI;
  idx_t in_R8;
  Vector *in_R9;
  byte in_stack_00000008;
  ValidityMask *validity_mask;
  idx_t cur_line;
  bool all_converted;
  undefined1 local_40 [15];
  byte local_31;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  idx_t local_28;
  undefined8 local_8;
  
  local_31 = in_stack_00000008 & 1;
  local_40[0xe] = 1;
  local_40._0_8_ = (unsigned_long *)0x0;
  local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_R9;
  local_28 = in_R8;
  local_8 = in_RDI;
  pVVar1 = FlatVector::Validity((Vector *)0x1797825);
  fun.parameters = (CastParameters *)pVVar1;
  fun.options = (map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                 *)&local_31;
  fun.all_converted = (bool *)local_8;
  fun.line_error = (idx_t *)local_28;
  fun.cur_line = (idx_t *)(local_40 + 0xe);
  fun.nullify_error = (bool *)local_30._M_pi;
  fun.validity_mask = (ValidityMask *)local_40;
  UnaryExecutor::
  Execute<duckdb::string_t,duckdb::date_t,duckdb::CSVCast::TemplatedTryCastDateVector<duckdb::CSVCast::TryCastDateOperator,duckdb::date_t>(std::map<duckdb::LogicalTypeId,duckdb::CSVOption<duckdb::StrpTimeFormat>,std::less<duckdb::LogicalTypeId>,std::allocator<std::pair<duckdb::LogicalTypeId_const,duckdb::CSVOption<duckdb::StrpTimeFormat>>>>const&,duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&,unsigned_long&,bool)::_lambda(duckdb::string_t)_1_>
            ((Vector *)local_30._M_pi,(Vector *)(local_40 + 0xe),local_28,fun,
             (FunctionErrors)((ulong)local_8 >> 0x38));
  return (bool)(local_40[0xe] & 1);
}

Assistant:

static bool TemplatedTryCastDateVector(const map<LogicalTypeId, CSVOption<StrpTimeFormat>> &options,
	                                       Vector &input_vector, Vector &result_vector, idx_t count,
	                                       CastParameters &parameters, idx_t &line_error, bool nullify_error) {
		D_ASSERT(input_vector.GetType().id() == LogicalTypeId::VARCHAR);
		bool all_converted = true;
		idx_t cur_line = 0;
		auto &validity_mask = FlatVector::Validity(result_vector);
		UnaryExecutor::Execute<string_t, T>(input_vector, result_vector, count, [&](string_t input) {
			T result;
			if (!OP::Operation(options, input, result, *parameters.error_message)) {
				if (all_converted) {
					line_error = cur_line;
				}
				if (nullify_error) {
					validity_mask.SetInvalid(cur_line);
				}
				all_converted = false;
			}
			cur_line++;
			return result;
		});
		return all_converted;
	}